

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void * MAPMapPEFile(HANDLE hFile)

{
  uint uVar1;
  bool bVar2;
  IPalObject *pIVar3;
  int iVar4;
  PAL_ERROR PVar5;
  DWORD DVar6;
  CPalThread *pThread;
  IMAGE_DOS_HEADER *pIVar7;
  __off64_t _Var8;
  ssize_t sVar9;
  char *__s;
  size_t sVar10;
  CFileProcessLocalData *pCVar11;
  CFileProcessLocalData *pPEBaseAddress;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  size_t len;
  CFileProcessLocalData *pCVar15;
  CFileProcessLocalData *pCVar16;
  long in_FS_OFFSET;
  int in_stack_fffffffffffffe18;
  undefined2 in_stack_fffffffffffffe1c;
  ushort in_stack_fffffffffffffe1e;
  IMAGE_NT_HEADERS ntHeader;
  IMAGE_DOS_HEADER dosHeader;
  void *sectionData;
  undefined8 *local_88;
  IDataLock *pLocalDataLock;
  CFileProcessLocalData *pLocalData;
  IMAGE_DOS_HEADER *loadedHeader;
  int local_64;
  IPalObject *local_60;
  IPalObject *pFileObject;
  CFileProcessLocalData *local_50;
  undefined1 local_41 [8];
  char sectionName [9];
  
  sectionName._1_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_60 = (IPalObject *)0x0;
  local_88 = (undefined8 *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  pThread = CorUnix::InternalGetCurrentThread();
  pLocalData = (CFileProcessLocalData *)0x0;
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012e5da;
  DVar6 = 6;
  if (hFile == (HANDLE)0xffffffffffffffff) {
LAB_0012e091:
    pPEBaseAddress = (CFileProcessLocalData *)0x0;
  }
  else {
    iVar4 = (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                      (CorUnix::g_pObjectManager,pThread,hFile,CorUnix::aotFile,0x80000000);
    if ((iVar4 != 0) ||
       (iVar4 = (*local_60->_vptr_IPalObject[3])(local_60,pThread,0,&local_88,&pLocalDataLock),
       iVar4 != 0)) {
joined_r0x0012e279:
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012e5da;
      goto LAB_0012e091;
    }
    iVar4 = *(int *)&pLocalDataLock[1]._vptr_IDataLock;
    pIVar7 = (IMAGE_DOS_HEADER *)__errno_location();
    pIVar7->e_magic = 0;
    pIVar7->e_cblp = 0;
    _Var8 = lseek64(iVar4,0,0);
    if ((_Var8 != 0) ||
       (sVar9 = read(iVar4,ntHeader.OptionalHeader.DataDirectory + 0xf,0x40), sVar9 != 0x40)) {
      DVar6 = FILEGetLastErrorFromErrno();
      goto joined_r0x0012e279;
    }
    loadedHeader = pIVar7;
    _Var8 = lseek64(iVar4,(long)(int)dosHeader.e_res2._12_4_,0);
    if ((_Var8 == (int)dosHeader.e_res2._12_4_) &&
       (sVar9 = read(iVar4,&stack0xfffffffffffffe18,0x108), sVar9 == 0x108)) {
      if (((short)ntHeader.OptionalHeader.DataDirectory[0xf].VirtualAddress == 0x5a4d) &&
         (((in_stack_fffffffffffffe18 == 0x4550 &&
           ((short)ntHeader.FileHeader.NumberOfSymbols == 0x20b)) &&
          (0xfff < ntHeader.OptionalHeader.ImageBase._4_4_)))) {
        uVar13 = (ulong)(uint)ntHeader.OptionalHeader._48_4_;
        if (((ntHeader.OptionalHeader._16_8_ != 0) && (ntHeader.OptionalHeader._48_4_ != 0)) &&
           (!CARRY8(ntHeader.OptionalHeader._16_8_,uVar13))) {
          pFileObject = (IPalObject *)ntHeader.OptionalHeader._16_8_;
          __s = getenv("PAL_ForceRelocs");
          local_64 = iVar4;
          if ((__s == (char *)0x0) || (sVar10 = strlen(__s), pIVar3 = pFileObject, sVar10 == 0)) {
            local_50 = (CFileProcessLocalData *)0x0;
LAB_0012e29f:
            bVar2 = false;
          }
          else {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012e5da;
            pCVar11 = (CFileProcessLocalData *)mmap64(pFileObject,0x1000,0,0x30,-1,0);
            if (pCVar11 == (CFileProcessLocalData *)0xffffffffffffffff) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012e5da;
              local_50 = (CFileProcessLocalData *)0xffffffffffffffff;
              goto LAB_0012e29f;
            }
            bVar2 = true;
            local_50 = pCVar11;
            if ((pCVar11 != (CFileProcessLocalData *)pIVar3) &&
               (PAL_InitializeChakraCoreCalled == false)) goto LAB_0012e5da;
          }
          CorUnix::InternalEnterCriticalSection(pThread,&mapping_critsec);
          pPEBaseAddress = (CFileProcessLocalData *)mmap64(pFileObject,uVar13,0,0x22,-1,0);
          pCVar11 = local_50;
          if (pPEBaseAddress == (CFileProcessLocalData *)0xffffffffffffffff) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012e5da;
            iVar4._0_2_ = loadedHeader->e_magic;
            iVar4._2_2_ = loadedHeader->e_cblp;
            strerror(iVar4);
            pPEBaseAddress = (CFileProcessLocalData *)0x0;
            DVar6 = FILEGetLastErrorFromErrno();
            goto LAB_0012e455;
          }
          if (bVar2) {
            if ((CFileProcessLocalData *)pFileObject == pPEBaseAddress) {
              fprintf(_stderr,"] %s %s:%d","MAPMapPEFile",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                      ,0x980);
              fprintf(_stderr,"Expression: ((SIZE_T)loadedBase) != preferredBase\n");
            }
            munmap(pCVar11,0x1000);
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012e5da;
          PVar5 = MAPmmapAndRecord(local_60,pPEBaseAddress,pPEBaseAddress,0x1000,1,local_64,0,
                                   (off_t)&pLocalData,
                                   (LPVOID *)
                                   CONCAT26(in_stack_fffffffffffffe1e,
                                            CONCAT24(in_stack_fffffffffffffe1c,
                                                     in_stack_fffffffffffffe18)));
          pCVar11 = pLocalData;
          if (PVar5 == 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012e5da;
            if (pLocalData != pPEBaseAddress) {
              fprintf(_stderr,"] %s %s:%d","MAPMapPEFile",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                     );
              fprintf(_stderr,"Expression: loadedHeader == loadedBase\n");
            }
            lVar12 = (long)*(int *)(pCVar11->unix_filename + 0x24);
            uVar14 = (ulong)(ushort)ntHeader.FileHeader.PointerToSymbolTable;
            pCVar16 = (CFileProcessLocalData *)(pCVar11->unix_filename + uVar14 + lVar12);
            if (pPEBaseAddress <= pCVar16) {
              loadedHeader = (IMAGE_DOS_HEADER *)((ulong)in_stack_fffffffffffffe1e * 0x28);
              pCVar15 = (CFileProcessLocalData *)
                        ((long)loadedHeader->e_res +
                        (long)(pCVar11->unix_filename + uVar14 + lVar12 + -0x1c));
              if ((pCVar16 <= pCVar15) &&
                 (local_50 = (CFileProcessLocalData *)
                             (pPEBaseAddress->unix_filename + (uVar13 - 0x18)), pCVar15 <= local_50)
                 ) {
                pFileObject = (IPalObject *)(pCVar11->unix_filename + lVar12 + uVar14 + 8);
                uVar13 = 0x1000;
                pCVar11 = pPEBaseAddress;
                for (pIVar7 = (IMAGE_DOS_HEADER *)0x0; loadedHeader != pIVar7;
                    pIVar7 = (IMAGE_DOS_HEADER *)pIVar7->e_res2) {
                  pCVar15 = (CFileProcessLocalData *)
                            (pPEBaseAddress->unix_filename +
                            ((ulong)*(uint *)((undefined1 *)
                                              ((long)&pFileObject->_vptr_IPalObject + 4) +
                                             (long)pIVar7) - 0x18));
                  if (pCVar15 < pPEBaseAddress) goto LAB_0012e447;
                  uVar1 = *(uint *)((long)pIVar7->e_res +
                                   (long)((long)&(pFileObject + 1)[-4]._vptr_IPalObject + 4));
                  len = (size_t)uVar1;
                  if (((((CFileProcessLocalData *)(pCVar15->unix_filename + (len - 0x18)) < pCVar15)
                       || (local_50 <
                           (CFileProcessLocalData *)(pCVar15->unix_filename + (len - 0x18)))) ||
                      (pCVar11 = (CFileProcessLocalData *)(pCVar11->unix_filename + (uVar13 - 0x18))
                      , pCVar15 < pCVar11)) ||
                     (uVar1 < *(uint *)((long)pIVar7->e_res +
                                       (long)((long)&pFileObject[-4]._vptr_IPalObject + 4))))
                  goto LAB_0012e447;
                  if (pCVar11 < pCVar15) {
                    PVar5 = MAPRecordMapping(local_60,pPEBaseAddress,pCVar11,
                                             (long)pCVar15 - (long)pCVar11,0);
                    if (PVar5 != 0) goto joined_r0x0012e5d4;
                    len = (size_t)*(uint *)((long)pIVar7->e_res +
                                           (long)((long)&(pFileObject + 1)[-4]._vptr_IPalObject + 4)
                                           );
                  }
                  uVar1 = *(uint *)((undefined1 *)((long)&pFileObject[3]._vptr_IPalObject + 4) +
                                   (long)pIVar7);
                  PVar5 = MAPmmapAndRecord(local_60,pPEBaseAddress,pCVar15,len,
                                           uVar1 >> 0x1e | uVar1 >> 0x1b & 4,local_64,
                                           *(int *)((undefined1 *)
                                                    ((long)&pFileObject[1]._vptr_IPalObject + 4) +
                                                   (long)pIVar7),(off_t)(dosHeader.e_res2 + 8),
                                           (LPVOID *)
                                           CONCAT26(in_stack_fffffffffffffe1e,
                                                    CONCAT24(in_stack_fffffffffffffe1c,
                                                             in_stack_fffffffffffffe18)));
                  if (PVar5 != 0) goto joined_r0x0012e5d4;
                  sectionName[0] = '\0';
                  memcpy(local_41,(void *)((long)pIVar7->e_res +
                                          (long)(pCVar16->unix_filename + -0x34)),8);
                  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012e5da;
                  uVar13 = (ulong)(*(int *)((long)pIVar7->e_res +
                                           (long)((long)&(pFileObject + 1)[-4]._vptr_IPalObject + 4)
                                           ) + 0xfffU & 0xfffff000);
                  pCVar11 = pCVar15;
                }
                pCVar11 = (CFileProcessLocalData *)(pCVar11->unix_filename + (uVar13 - 0x18));
                DVar6 = 0;
                if (pCVar11 < local_50) {
                  DVar6 = 0;
                  PVar5 = MAPRecordMapping(local_60,pPEBaseAddress,pCVar11,
                                           (long)local_50 - (long)pCVar11,0);
                  if (PVar5 != 0) goto joined_r0x0012e5d4;
                }
                goto LAB_0012e455;
              }
            }
LAB_0012e447:
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012e5da;
            DVar6 = 0x57;
          }
          else {
joined_r0x0012e5d4:
            DVar6 = PVar5;
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012e5da;
          }
LAB_0012e455:
          CorUnix::InternalLeaveCriticalSection(pThread,&mapping_critsec);
          goto LAB_0012e094;
        }
      }
      goto joined_r0x0012e279;
    }
    pPEBaseAddress = (CFileProcessLocalData *)0x0;
    DVar6 = FILEGetLastErrorFromErrno();
  }
LAB_0012e094:
  if (local_88 != (undefined8 *)0x0) {
    (**(code **)*local_88)(local_88,pThread,0);
  }
  if (local_60 != (IPalObject *)0x0) {
    (*local_60->_vptr_IPalObject[8])(local_60,pThread);
  }
  if (DVar6 == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012e5da;
  }
  else {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_0012e5da:
      abort();
    }
    if (pPEBaseAddress != (CFileProcessLocalData *)0x0) {
      MAPUnmapPEFile(pPEBaseAddress);
    }
    pPEBaseAddress = (CFileProcessLocalData *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != sectionName._1_8_) {
    __stack_chk_fail();
  }
  return pPEBaseAddress;
}

Assistant:

void * MAPMapPEFile(HANDLE hFile)
{
    PAL_ERROR palError = 0;
    IPalObject *pFileObject = NULL;
    IDataLock *pLocalDataLock = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    CPalThread *pThread = InternalGetCurrentThread();
    void * loadedBase = NULL;
    IMAGE_DOS_HEADER * loadedHeader = NULL;
    void * retval;
#if _DEBUG
    bool forceRelocs = false;
#endif

    ENTRY("MAPMapPEFile (hFile=%p)\n", hFile);

    //Step 0: Verify values, find internal pal data structures.
    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR_(LOADER)( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto done;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
            pThread,
            hFile,
            &aotFile,
            GENERIC_READ,
            &pFileObject
            );
    if (NO_ERROR != palError)
    {
        ERROR_(LOADER)( "ReferenceObjectByHandle failed\n" );
        goto done;
    }

    palError = pFileObject->GetProcessLocalData(
            pThread,
            ReadLock,
            &pLocalDataLock,
            reinterpret_cast<void**>(&pLocalData)
            );
    if (NO_ERROR != palError)
    {
        ERROR_(LOADER)( "GetProcessLocalData failed\n" );
        goto done;
    }

    int fd;
    fd = pLocalData->unix_fd;
    //Step 1: Read the PE headers and reserve enough space for the whole image somewhere.
    IMAGE_DOS_HEADER dosHeader;
    IMAGE_NT_HEADERS ntHeader;
    errno = 0;
    if (0 != lseek(fd, 0, SEEK_SET))
    {
        palError = FILEGetLastErrorFromErrno();
        ERROR_(LOADER)( "lseek failed\n" );
        goto done;
    }
    if (sizeof(dosHeader) != read(fd, &dosHeader, sizeof(dosHeader)))
    {
        palError = FILEGetLastErrorFromErrno();
        ERROR_(LOADER)( "reading dos header failed\n" );
        goto done;
    }
    if (dosHeader.e_lfanew != lseek(fd, dosHeader.e_lfanew, SEEK_SET))
    {
        palError = FILEGetLastErrorFromErrno();
        goto done;
    }
    if (sizeof(ntHeader) != read(fd, &ntHeader, sizeof(ntHeader)))
    {
        palError = FILEGetLastErrorFromErrno();
        goto done;
    }

    if ((VAL16(IMAGE_DOS_SIGNATURE) != VAL16(dosHeader.e_magic))
        || (VAL32(IMAGE_NT_SIGNATURE) != VAL32(ntHeader.Signature))
        || (VAL16(IMAGE_NT_OPTIONAL_HDR_MAGIC) != VAL16(ntHeader.OptionalHeader.Magic) ) )
    {
        ERROR_(LOADER)( "Magic number mismatch\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    //this code requires that the file alignment be the same as the page alignment
    if (ntHeader.OptionalHeader.FileAlignment < VIRTUAL_PAGE_SIZE)
    {
        ERROR_(LOADER)( "Optional header file alignment is bad\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    //This doesn't read the entire NT header (the optional header technically has a variable length.  But I
    //don't need more directories.

    //I now know how big the file is.  Reserve enough address space for the whole thing.  Try to get the
    //preferred base.  Create the intial mapping as "no access".  We'll use that for the guard pages in the
    //"holes" between sections.
    SIZE_T preferredBase, virtualSize;
    preferredBase = ntHeader.OptionalHeader.ImageBase;
    virtualSize = ntHeader.OptionalHeader.SizeOfImage;

    // Validate the image header
    if (   (preferredBase == 0)
        || (virtualSize == 0)
        || (preferredBase + virtualSize < preferredBase)    // Does the image overflow?
        )
    {
        ERROR_(LOADER)( "image is corrupt\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

#if _DEBUG
    char * envVar;
    envVar = getenv("PAL_ForceRelocs");
    if (envVar && strlen(envVar) > 0)
    {
        forceRelocs = true;
        TRACE_(LOADER)("Forcing rebase of image\n");
    }
    void * pForceRelocBase;
    pForceRelocBase = NULL;
    if (forceRelocs)
    {
        //if we're forcing relocs, create an anonymous mapping at the preferred base.  Only create the
        //mapping if we can create it at the specified address.
        pForceRelocBase = mmap( (void*)preferredBase, VIRTUAL_PAGE_SIZE, PROT_NONE, MAP_ANON|MAP_FIXED, -1, 0 );
        if (pForceRelocBase == MAP_FAILED)
        {
            TRACE_(LOADER)("Attempt to take preferred base of %p to force relocation failed\n", (void*)preferredBase);
            forceRelocs = false;
        }
        else if ((void*)preferredBase != pForceRelocBase)
        {
            TRACE_(LOADER)("Attempt to take preferred base of %p to force relocation failed; actually got %p\n", (void*)preferredBase, pForceRelocBase);
        }
    }
#endif // _DEBUG

    // The first mmap mapping covers the entire file but just reserves space. Subsequent mappings cover
    // individual parts of the file, and actually map pages in. Note that according to the mmap() man page, "A
    // successful mmap deletes any previous mapping in the allocated address range." Also, "If a MAP_FIXED
    // request is successful, the mapping established by mmap() replaces any previous mappings for the process' pages
    // in the range from addr to addr + len." Thus, we will record a series of mappings here, one for the header
    // and each of the sections, as well as all the space between them that we give PROT_NONE protections.

    // We're going to start adding mappings to the mapping list, so take the critical section
    InternalEnterCriticalSection(pThread, &mapping_critsec);

#if !defined(_AMD64_)
    loadedBase = mmap((void*)preferredBase, virtualSize, PROT_NONE, MAP_ANON, -1, 0);
#else // defined(_AMD64_)    
    // MAC64 requires we pass MAP_SHARED (or MAP_PRIVATE) flags - otherwise, the call is failed. 
    // Refer to mmap documentation at http://www.manpagez.com/man/2/mmap/ for details.
    loadedBase = mmap((void*)preferredBase, virtualSize, PROT_NONE, MAP_ANON|MAP_PRIVATE, -1, 0);
#endif // !defined(_AMD64_)

    if (MAP_FAILED == loadedBase)
    {
        ERROR_(LOADER)( "mmap failed with code %d: %s.\n", errno, strerror( errno ) );
        palError = FILEGetLastErrorFromErrno();
        loadedBase = NULL; // clear it so we don't try to use it during clean-up
        goto doneReleaseMappingCriticalSection;
    }

    // All subsequent mappings of the PE file will be in the range [loadedBase, loadedBase + virtualSize)

#if _DEBUG
    if (forceRelocs)
    {
        _ASSERTE(((SIZE_T)loadedBase) != preferredBase);
        munmap(pForceRelocBase, VIRTUAL_PAGE_SIZE); // now that we've forced relocation, let the original address mapping go
    }
    if (((SIZE_T)loadedBase) != preferredBase)
    {
        TRACE_(LOADER)("Image rebased from preferredBase of %p to loadedBase of %p\n", preferredBase, loadedBase);
    }
    else
    {
        TRACE_(LOADER)("Image loaded at preferred base %p\n", loadedBase);
    }
#endif // _DEBUG

    //we have now reserved memory (potentially we got rebased).  Walk the PE sections and map each part
    //separately.

    size_t headerSize;
    headerSize = VIRTUAL_PAGE_SIZE; // if there are lots of sections, this could be wrong

    //first, map the PE header to the first page in the image.  Get pointers to the section headers
    palError = MAPmmapAndRecord(pFileObject, loadedBase,
                    loadedBase, headerSize, PROT_READ, MAP_FILE|MAP_PRIVATE|MAP_FIXED, fd, 0,
                    (void**)&loadedHeader);
    if (NO_ERROR != palError)
    {
        ERROR_(LOADER)( "mmap of PE header failed\n" );
        goto doneReleaseMappingCriticalSection;
    }

    TRACE_(LOADER)("PE header loaded @ %p\n", loadedHeader);
    _ASSERTE(loadedHeader == loadedBase); // we already preallocated the space, and we used MAP_FIXED, so we should have gotten this address
    IMAGE_SECTION_HEADER * firstSection;
    firstSection = (IMAGE_SECTION_HEADER*)(((char *)loadedHeader)
                                           + loadedHeader->e_lfanew
                                           + offsetof(IMAGE_NT_HEADERS, OptionalHeader)
                                           + VAL16(ntHeader.FileHeader.SizeOfOptionalHeader));
    unsigned numSections;
    numSections = ntHeader.FileHeader.NumberOfSections;

    // Validation
    char* sectionHeaderEnd;
    sectionHeaderEnd = (char*)firstSection + numSections * sizeof(IMAGE_SECTION_HEADER);
    if (   ((void*)firstSection < loadedBase)
        || ((char*)firstSection > sectionHeaderEnd)
        || (sectionHeaderEnd > (char*)loadedBase + virtualSize)
        )
    {
        ERROR_(LOADER)( "image is corrupt\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto doneReleaseMappingCriticalSection;
    }

    void* prevSectionBase;
    prevSectionBase = loadedBase; // the first "section" for our purposes is the header
    size_t prevSectionSizeInMemory;
    prevSectionSizeInMemory = headerSize;
    for (unsigned i = 0; i < numSections; ++i)
    {
        //for each section, map the section of the file to the correct virtual offset.  Gather the
        //protection bits from the PE file and convert them to the correct mmap PROT_* flags.
        void * sectionData;
        int prot = 0;
        IMAGE_SECTION_HEADER &currentHeader = firstSection[i];

        void* sectionBase = (char*)loadedBase + currentHeader.VirtualAddress;

        // Validate the section header
        if (   (sectionBase < loadedBase)                                                           // Did computing the section base overflow?
            || ((char*)sectionBase + currentHeader.SizeOfRawData < (char*)sectionBase)              // Does the section overflow?
            || ((char*)sectionBase + currentHeader.SizeOfRawData > (char*)loadedBase + virtualSize) // Does the section extend past the end of the image as the header stated?
            || ((char*)prevSectionBase + prevSectionSizeInMemory > sectionBase)                     // Does this section overlap the previous one?
            )
        {
            ERROR_(LOADER)( "section %d is corrupt\n", i );
            palError = ERROR_INVALID_PARAMETER;
            goto doneReleaseMappingCriticalSection;
        }
        if (currentHeader.Misc.VirtualSize > currentHeader.SizeOfRawData)
        {
            ERROR_(LOADER)( "no support for zero-padded sections, section %d\n", i );
            palError = ERROR_INVALID_PARAMETER;
            goto doneReleaseMappingCriticalSection;
        }

        // Is there space between the previous section and this one? If so, add a PROT_NONE mapping to cover it.
        if ((char*)prevSectionBase + prevSectionSizeInMemory < sectionBase)
        {
            char* gapBase = (char*)prevSectionBase + prevSectionSizeInMemory;
            palError = MAPRecordMapping(pFileObject,
                            loadedBase,
                            (void*)gapBase,
                            (char*)sectionBase - gapBase,
                            PROT_NONE);
            if (NO_ERROR != palError)
            {
                ERROR_(LOADER)( "recording gap section before section %d failed\n", i );
                goto doneReleaseMappingCriticalSection;
            }
        }

        //Don't discard these sections.  We need them to verify PE files
        //if (currentHeader.Characteristics & IMAGE_SCN_MEM_DISCARDABLE)
        //    continue;
        if (currentHeader.Characteristics & IMAGE_SCN_MEM_EXECUTE)
            prot |= PROT_EXEC;
        if (currentHeader.Characteristics & IMAGE_SCN_MEM_READ)
            prot |= PROT_READ;
        if (currentHeader.Characteristics & IMAGE_SCN_MEM_WRITE)
            prot |= PROT_WRITE;

        palError = MAPmmapAndRecord(pFileObject, loadedBase,
                        sectionBase,
                        currentHeader.SizeOfRawData,
                        prot,
                        MAP_FILE|MAP_PRIVATE|MAP_FIXED,
                        fd,
                        currentHeader.PointerToRawData,
                        &sectionData);
        if (NO_ERROR != palError)
        {
            ERROR_(LOADER)( "mmap of section %d failed\n", i );
            goto doneReleaseMappingCriticalSection;
        }

#if _DEBUG
        {
            // Ensure null termination of section name (which is allowed to not be null terminated if exactly 8 characters long)
            char sectionName[9];
            sectionName[8] = '\0';
            memcpy(sectionName, currentHeader.Name, sizeof(currentHeader.Name));
            TRACE_(LOADER)("Section %d '%s' (header @ %p) loaded @ %p (RVA: 0x%x, SizeOfRawData: 0x%x, PointerToRawData: 0x%x)\n",
                i, sectionName, &currentHeader, sectionData, currentHeader.VirtualAddress, currentHeader.SizeOfRawData, currentHeader.PointerToRawData);
        }
#endif // _DEBUG

        prevSectionBase = sectionBase;
        prevSectionSizeInMemory = (currentHeader.SizeOfRawData + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK; // round up to page boundary
    }

    // Is there space after the last section and before the end of the mapped image? If so, add a PROT_NONE mapping to cover it.
    char* imageEnd;
    imageEnd = (char*)loadedBase + virtualSize; // actually, points just after the mapped end
    if ((char*)prevSectionBase + prevSectionSizeInMemory < imageEnd)
    {
        char* gapBase = (char*)prevSectionBase + prevSectionSizeInMemory;
        palError = MAPRecordMapping(pFileObject,
                        loadedBase,
                        (void*)gapBase,
                        imageEnd - gapBase,
                        PROT_NONE);
        if (NO_ERROR != palError)
        {
            ERROR_(LOADER)( "recording end of image gap section failed\n" );
            goto doneReleaseMappingCriticalSection;
        }
    }

    palError = ERROR_SUCCESS;

doneReleaseMappingCriticalSection:

    InternalLeaveCriticalSection(pThread, &mapping_critsec);

done:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    if (palError == ERROR_SUCCESS)
    {
        retval = loadedBase;
        LOGEXIT("MAPMapPEFile returns %p\n", retval);
    }
    else
    {
        retval = NULL;
        LOGEXIT("MAPMapPEFile error: %d\n", palError);

        // If we had an error, and had mapped anything, we need to unmap it
        if (loadedBase != NULL)
        {
            MAPUnmapPEFile(loadedBase);
        }
    }
    return retval;
}